

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::MergeFrom
          (CategoricalCrossEntropyLossLayer *this,CategoricalCrossEntropyLossLayer *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11fcb);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  psVar2 = (from->input_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->input_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->input_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->target_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->target_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->target_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  return;
}

Assistant:

void CategoricalCrossEntropyLossLayer::MergeFrom(const CategoricalCrossEntropyLossLayer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.input().size() > 0) {

    input_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.input_);
  }
  if (from.target().size() > 0) {

    target_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.target_);
  }
}